

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileLibraryTargetGenerator::WriteSharedLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  undefined1 linkLineComputer [8];
  bool bVar3;
  pointer *__ptr;
  string extraFlags;
  string linkLanguage;
  string linkRuleVar;
  undefined1 local_d8 [8];
  cmStateDirectory local_d0;
  undefined1 local_a8 [32];
  string local_88;
  string local_68;
  string local_48;
  
  bVar3 = cmGeneratorTarget::IsFrameworkOnApple
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (bVar3) {
    WriteFrameworkRules(this,relink);
    return;
  }
  if (!relink) {
    pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
              ((string *)(local_d8 + 8),&this->super_cmMakefileTargetGenerator);
    bVar3 = requireDeviceLinking(pcVar1,(cmLocalGenerator *)pcVar2,(string *)(local_d8 + 8));
    std::__cxx11::string::~string((string *)(local_d8 + 8));
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_d8 + 8),"CMAKE_CUDA_DEVICE_LINK_LIBRARY",
                 (allocator<char> *)&local_88);
      WriteDeviceLibraryRules(this,(string *)(local_d8 + 8),false);
      std::__cxx11::string::~string((string *)(local_d8 + 8));
    }
  }
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)(local_d8 + 8),&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetLinkerLanguage(&local_88,pcVar1,(string *)(local_d8 + 8));
  std::__cxx11::string::~string((string *)(local_d8 + 8));
  cmStrCat<char_const(&)[7],std::__cxx11::string&,char_const(&)[23]>
            (&local_48,(char (*) [7])0x6bfdfb,&local_88,(char (*) [23])"_CREATE_SHARED_LIBRARY");
  local_a8._0_8_ = local_a8 + 0x10;
  local_a8._8_8_ = (pointer)0x0;
  local_a8[0x10] = false;
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,(string *)local_a8,&local_88);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_d8 + 8),"CMAKE_SHARED_LINKER_FLAGS",(allocator<char> *)local_d8);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_68,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)pcVar2,(string *)local_a8,(string *)(local_d8 + 8),&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)(local_d8 + 8));
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_68,(cmLocalGenerator *)pcVar2);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)(local_d8 + 8),(cmStateSnapshot *)&local_68);
  cmMakefileTargetGenerator::CreateLinkLineComputer
            ((cmMakefileTargetGenerator *)local_d8,(cmOutputConverter *)this,
             (cmStateDirectory *)pcVar2);
  linkLineComputer = local_d8;
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)(local_d8 + 8),&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AppendModuleDefinitionFlag
            ((cmLocalGenerator *)pcVar2,(string *)local_a8,pcVar1,
             (cmLinkLineComputer *)linkLineComputer,(string *)(local_d8 + 8));
  std::__cxx11::string::~string((string *)(local_d8 + 8));
  bVar3 = cmLocalGenerator::AppendLWYUFlags
                    ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
                     (string *)local_a8,
                     (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget,&local_88);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.UseLWYU = bVar3;
  WriteLibraryRules(this,&local_48,(string *)local_a8,relink);
  if (local_d8 != (undefined1  [8])0x0) {
    (*(*(_func_int ***)local_d8)[1])();
  }
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteSharedLibraryRules(bool relink)
{
  if (this->GeneratorTarget->IsFrameworkOnApple()) {
    this->WriteFrameworkRules(relink);
    return;
  }

  if (!relink) {
    const bool requiresDeviceLinking = requireDeviceLinking(
      *this->GeneratorTarget, *this->LocalGenerator, this->GetConfigName());
    if (requiresDeviceLinking) {
      this->WriteDeviceLibraryRules("CMAKE_CUDA_DEVICE_LINK_LIBRARY", relink);
    }
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());
  std::string linkRuleVar =
    cmStrCat("CMAKE_", linkLanguage, "_CREATE_SHARED_LIBRARY");

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_SHARED_LINKER_FLAGS", this->GetConfigName());

  std::unique_ptr<cmLinkLineComputer> linkLineComputer =
    this->CreateLinkLineComputer(
      this->LocalGenerator,
      this->LocalGenerator->GetStateSnapshot().GetDirectory());

  this->LocalGenerator->AppendModuleDefinitionFlag(
    extraFlags, this->GeneratorTarget, linkLineComputer.get(),
    this->GetConfigName());

  this->UseLWYU = this->LocalGenerator->AppendLWYUFlags(
    extraFlags, this->GeneratorTarget, linkLanguage);

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}